

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

validator * __thiscall libchars::validation::get_validator_by_id(validation *this,id_t id)

{
  bool bVar1;
  pointer ppVar2;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_int,_const_libchars::validator_*>_> local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_int,_const_libchars::validator_*>_> local_28;
  const_iterator ii;
  id_t id_local;
  validation *this_local;
  
  if (id == 0) {
    this_local = (validation *)0x0;
  }
  else {
    ii._M_node._4_4_ = id;
    local_30._M_node =
         (_Base_ptr)
         std::
         map<int,_const_libchars::validator_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_libchars::validator_*>_>_>
         ::find(&this->i2v,(key_type *)((long)&ii._M_node + 4));
    std::_Rb_tree_const_iterator<std::pair<const_int,_const_libchars::validator_*>_>::
    _Rb_tree_const_iterator(&local_28,&local_30);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<int,_const_libchars::validator_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_libchars::validator_*>_>_>
         ::end(&this->i2v);
    std::_Rb_tree_const_iterator<std::pair<const_int,_const_libchars::validator_*>_>::
    _Rb_tree_const_iterator(&local_38,&local_40);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (bVar1) {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_const_libchars::validator_*>_>::
               operator->(&local_28);
      this_local = (validation *)ppVar2->second;
    }
    else {
      this_local = (validation *)0x0;
    }
  }
  return (validator *)this_local;
}

Assistant:

const validator *validation::get_validator_by_id(validator::id_t id)
    {
        if (id == validator::NONE)
            return NULL;

        validators_by_id_t::const_iterator ii = i2v.find(id);
        if (ii != i2v.end())
            return ii->second;
        else
            return NULL;
    }